

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O0

spv_result_t spvtools::val::anon_unknown_2::LimitCheckSwitch(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar2;
  spv_const_validator_options psVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_208;
  uint local_2c;
  ulong uStack_28;
  uint num_pairs_limit;
  size_t num_pairs;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  num_pairs = (size_t)inst;
  inst_local = (Instruction *)_;
  OVar1 = Instruction::opcode(inst);
  if (OVar1 == OpSwitch) {
    this = Instruction::operands((Instruction *)num_pairs);
    sVar2 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    uStack_28 = sVar2 - 2 >> 1;
    psVar3 = ValidationState_t::options((ValidationState_t *)inst_local);
    local_2c = (psVar3->universal_limits_).max_switch_branches;
    if (local_2c < uStack_28) {
      ValidationState_t::diag
                (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_BINARY,
                 (Instruction *)num_pairs);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_208,(char (*) [47])"Number of (literal, label) pairs in OpSwitch ("
                         );
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&stack0xffffffffffffffd8);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [22])") exceeds the limit (");
      pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_2c);
      pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [3])0x5b79e4);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_208);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t LimitCheckSwitch(ValidationState_t& _, const Instruction* inst) {
  if (spv::Op::OpSwitch == inst->opcode()) {
    // The instruction syntax is as follows:
    // OpSwitch <selector ID> <Default ID> literal label literal label ...
    // literal,label pairs come after the first 2 operands.
    // It is guaranteed at this point that num_operands is an even number.
    size_t num_pairs = (inst->operands().size() - 2) / 2;
    const unsigned int num_pairs_limit =
        _.options()->universal_limits_.max_switch_branches;
    if (num_pairs > num_pairs_limit) {
      return _.diag(SPV_ERROR_INVALID_BINARY, inst)
             << "Number of (literal, label) pairs in OpSwitch (" << num_pairs
             << ") exceeds the limit (" << num_pairs_limit << ").";
    }
  }
  return SPV_SUCCESS;
}